

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableGenerator.cpp
# Opt level: O3

void ShuffleDeck16(PCGRandom *prng,uint16_t *deck,uint32_t count)

{
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint64_t uVar9;
  uint16_t uVar10;
  
  *deck = 0;
  iVar7 = count - 1;
  uVar9 = prng->State;
  uVar2 = prng->Inc;
  if (0x100 < count) {
    uVar6 = 1;
    while( true ) {
      uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
      bVar4 = (byte)(uVar9 >> 0x3b);
      uVar8 = uVar8 >> bVar4 | uVar8 << 0x20 - bVar4;
      uVar9 = uVar9 * 0x5851f42d4c957f2d + uVar2;
      if (iVar7 == 0) break;
      if (iVar7 == 1) {
        prng->State = uVar9;
        uVar3 = (ulong)(uVar8 & 0xffff) % uVar6;
        deck[uVar6] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar6;
        return;
      }
      iVar7 = iVar7 + -2;
      uVar3 = (ulong)(uVar8 & 0xffff) % uVar6;
      deck[uVar6] = deck[uVar3];
      uVar5 = (int)uVar6 + 1;
      deck[uVar3] = (uint16_t)uVar6;
      uVar6 = (ulong)((int)uVar6 + 2);
      uVar3 = (ulong)(uVar8 >> 0x10) % (ulong)uVar5;
      deck[uVar5] = deck[uVar3];
      deck[uVar3] = (uint16_t)uVar5;
    }
switchD_00102461_caseD_0:
    prng->State = uVar9;
    return;
  }
  uVar8 = 4;
LAB_00102343:
  uVar6 = (ulong)(uVar8 - 3);
  uVar5 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
  bVar4 = (byte)(uVar9 >> 0x3b);
  uVar5 = uVar5 >> bVar4 | uVar5 << 0x20 - bVar4;
  uVar9 = uVar9 * 0x5851f42d4c957f2d + uVar2;
  uVar10 = (uint16_t)(uVar8 - 3);
  switch(iVar7) {
  case 0:
    goto switchD_00102461_caseD_0;
  case 1:
    uVar8 = uVar8 - 3;
    prng->State = uVar9;
    goto LAB_001024d0;
  case 2:
    prng->State = uVar9;
    break;
  case 3:
    prng->State = uVar9;
    uVar3 = (ulong)(uVar5 & 0xff) % uVar6;
    deck[uVar6] = deck[uVar3];
    deck[uVar3] = uVar10;
    uVar6 = (ulong)(uVar8 - 2);
    break;
  default:
    goto switchD_00102461_default;
  }
  uVar3 = (ulong)(uVar5 >> 8 & 0xff) % uVar6;
  deck[uVar6] = deck[uVar3];
  deck[uVar3] = (uint16_t)uVar6;
  uVar8 = (int)uVar6 + 1;
LAB_001024d0:
  uVar6 = (ulong)(uVar5 >> 0x10 & 0xff) % (ulong)uVar8;
  deck[uVar8] = deck[uVar6];
  deck[uVar6] = (uint16_t)uVar8;
  return;
switchD_00102461_default:
  iVar7 = iVar7 + -4;
  uVar3 = (ulong)(uVar5 & 0xff) % uVar6;
  deck[uVar6] = deck[uVar3];
  uVar1 = uVar8 - 2;
  deck[uVar3] = uVar10;
  uVar6 = (ulong)(uVar5 >> 8 & 0xff) % (ulong)uVar1;
  deck[uVar1] = deck[uVar6];
  deck[uVar6] = (uint16_t)uVar1;
  uVar1 = uVar8 - 1;
  uVar6 = (ulong)(uVar5 >> 0x10 & 0xff) % (ulong)uVar1;
  deck[uVar1] = deck[uVar6];
  deck[uVar6] = (uint16_t)uVar1;
  uVar6 = (ulong)(uVar5 >> 0x18) % (ulong)uVar8;
  deck[uVar8] = deck[uVar6];
  deck[uVar6] = (uint16_t)uVar8;
  uVar8 = uVar8 + 4;
  goto LAB_00102343;
}

Assistant:

void ShuffleDeck16(
    PCGRandom &prng,
    uint16_t * deck,
    const uint32_t count)
{
    deck[0] = 0;

    // If we can unroll 4 times:
    if (count <= 256)
    {
        for (uint32_t ii = 1;;)
        {
            uint32_t jj, rv = prng.Next();

            // 8-bit unroll
            switch (count - ii)
            {
            default:
                jj = (uint8_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 8) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 24) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                break;

            case 3:
                jj = (uint8_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
            case 2:
                jj = (uint8_t)(rv >> 8) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
            case 1:
                jj = (uint8_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
            case 0:
                return;
            }
        }
    }
    else
    {
        // For each deck entry:
        for (uint32_t ii = 1;;)
        {
            uint32_t jj, rv = prng.Next();

            // 16-bit unroll
            switch (count - ii)
            {
            default:
                jj = (uint16_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint16_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                break;

            case 1:
                jj = (uint16_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
            case 0:
                return;
            }
        }
    }
}